

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modhelp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Option *pOVar2;
  CallForHelp *this;
  ostream *poVar3;
  Error *e;
  string local_330;
  allocator local_309;
  string local_308;
  undefined1 local_2e8 [8];
  string some_option;
  string local_2c0;
  allocator local_299;
  string local_298;
  Option *local_278;
  Option *help;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  App test;
  char **argv_local;
  int argc_local;
  
  test.config_ptr_ = (Option *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"",&local_209);
  CLI::App::App((App *)local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"",(allocator *)((long)&help + 7));
  CLI::App::set_help_flag((App *)local_1e8,&local_240,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&help + 7));
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"-h,--help",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c0,"Request help",
             (allocator *)(some_option.field_2._M_local_buf + 0xf));
  pOVar2 = CLI::App::add_flag((App *)local_1e8,&local_298,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)(some_option.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  local_278 = pOVar2;
  std::__cxx11::string::string((string *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"-a",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"Some description",(allocator *)((long)&e + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_1e8,&local_308,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
             &local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  CLI::App::parse((App *)local_1e8,argc,(char **)test.config_ptr_);
  bVar1 = CLI::Option::operator_cast_to_bool(local_278);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Option string:");
    poVar3 = std::operator<<(poVar3,(string *)local_2e8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_2e8);
    CLI::App::~App((App *)local_1e8);
    return 0;
  }
  this = (CallForHelp *)__cxa_allocate_exception(0x38);
  CLI::CallForHelp::CallForHelp(this);
  __cxa_throw(this,&CLI::CallForHelp::typeinfo,CLI::CallForHelp::~CallForHelp);
}

Assistant:

int main(int argc, char **argv) {
    CLI::App test;

    // Remove help flag because it shortcuts all processing
    test.set_help_flag();

    // Add custom flag that activates help
    auto help = test.add_flag("-h,--help", "Request help");

    std::string some_option;
    test.add_option("-a", some_option, "Some description");

    try {
        test.parse(argc, argv);
        if(*help)
            throw CLI::CallForHelp();
    } catch(const CLI::Error &e) {
        std::cout << "Option string:" << some_option << std::endl;
        return test.exit(e);
    }

    std::cout << "Option string:" << some_option << std::endl;
    return 0;
}